

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long>::InitializeEqualFromList
          (TPZFMatrix<long> *this,initializer_list<std::initializer_list<long>_> *list)

{
  iterator plVar1;
  long *plVar2;
  uint32_t row_n;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  iterator piVar6;
  iterator piVar7;
  
  piVar6 = list->_M_array;
  piVar7 = piVar6 + list->_M_len;
  (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,list->_M_len,piVar6->_M_len);
  uVar3 = 0;
  for (; piVar6 != piVar7; piVar6 = piVar6 + 1) {
    plVar1 = piVar6->_M_array;
    plVar2 = this->fElem;
    uVar5 = 0;
    for (lVar4 = piVar6->_M_len << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
      plVar2[(ulong)uVar3 +
             (uVar5 & 0xffffffff) * (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow] =
           plVar1[uVar5];
      uVar5 = uVar5 + 1;
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializeEqualFromList (const std::initializer_list< std::initializer_list<TVar> >& list){
    size_t n_row = list.size();
    size_t n_col = 1;

    auto row_it = list.begin();
    auto row_it_end = list.end();

#ifdef PZDEBUG
    bool col_n_found = false;
    for (auto it = row_it; it != row_it_end; it++) {
        if (!col_n_found) {
            n_col = it->size();
            col_n_found = true;
        }
        else {
            if (n_col != it->size())
                this->Error("TPZFMatrix constructor: inconsistent number of columns in initializer list");
        }
    }
#else
    n_col = row_it->size();
#endif
    this->Resize(n_row, n_col);

    for (uint32_t row_n = 0; row_it != row_it_end; row_it++, row_n++) {
        auto col_it = row_it->begin();
        auto col_it_end = row_it->end();
        for (uint32_t col_n = 0; col_it != col_it_end; col_it++, col_n++) {
            this->fElem[col_n * this->fRow + row_n] = *col_it;
        }
    }
}